

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_function_binder.cpp
# Opt level: O2

void __thiscall
duckdb::TableFunctionBinder::TableFunctionBinder
          (TableFunctionBinder *this,Binder *binder,ClientContext *context,
          string *table_function_name_p)

{
  ExpressionBinder::ExpressionBinder(&this->super_ExpressionBinder,binder,context,false);
  (this->super_ExpressionBinder)._vptr_ExpressionBinder =
       (_func_int **)&PTR__TableFunctionBinder_0278ebe8;
  ::std::__cxx11::string::string
            ((string *)&this->table_function_name,(string *)table_function_name_p);
  return;
}

Assistant:

TableFunctionBinder::TableFunctionBinder(Binder &binder, ClientContext &context, string table_function_name_p)
    : ExpressionBinder(binder, context), table_function_name(std::move(table_function_name_p)) {
}